

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void lexer_IncIFDepth(void)

{
  LexerState *pLVar1;
  IfStack *pIVar2;
  int *piVar3;
  char *pcVar4;
  
  pIVar2 = (IfStack *)malloc(0x10);
  if (pIVar2 != (IfStack *)0x0) {
    pIVar2->ranIfBlock = false;
    pLVar1 = lexerState;
    pIVar2->reachedElseBlock = false;
    pIVar2->next = lexerState->ifStack;
    pLVar1->ifStack = pIVar2;
    return;
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  fatalerror("Unable to allocate new IF depth: %s\n",pcVar4);
}

Assistant:

void lexer_IncIFDepth(void)
{
	struct IfStack *ifStack = (struct IfStack *)malloc(sizeof(*ifStack));

	if (!ifStack)
		fatalerror("Unable to allocate new IF depth: %s\n", strerror(errno));

	ifStack->ranIfBlock = false;
	ifStack->reachedElseBlock = false;
	ifStack->next = lexerState->ifStack;

	lexerState->ifStack = ifStack;
}